

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O0

bool crnlib::string_to_uint64(char **pBuf,uint64 *value)

{
  int iVar1;
  ulong *in_RSI;
  undefined8 *in_RDI;
  bool bVar2;
  uint c;
  uint64 result2;
  uint64 result8;
  uint64 result;
  char *p;
  ulong local_28;
  char *local_20;
  
  *in_RSI = 0;
  local_20 = (char *)*in_RDI;
  while( true ) {
    bVar2 = false;
    if (*local_20 != '\0') {
      iVar1 = isspace((int)*local_20);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    local_20 = local_20 + 1;
  }
  local_28 = 0;
  iVar1 = isdigit((int)*local_20);
  if (iVar1 != 0) {
    while( true ) {
      bVar2 = false;
      if (*local_20 != '\0') {
        iVar1 = isdigit((int)*local_20);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) {
        *in_RSI = local_28;
        *in_RDI = local_20;
        return true;
      }
      if ((local_28 & 0xe000000000000000) != 0) {
        return false;
      }
      if (local_28 * -8 - 1 < local_28 * 2) {
        return false;
      }
      if (local_28 * -10 - 1 < (ulong)((int)*local_20 - 0x30U)) break;
      local_28 = (ulong)((int)*local_20 - 0x30U) + local_28 * 10;
      local_20 = local_20 + 1;
    }
  }
  return false;
}

Assistant:

bool string_to_uint64(const char*& pBuf, uint64& value) {
  value = 0;

  CRNLIB_ASSERT(pBuf);
  const char* p = pBuf;

  while (*p && isspace(*p))
    p++;

  uint64 result = 0;

  if (!isdigit(*p))
    return false;

  while (*p && isdigit(*p)) {
    if (result & 0xE000000000000000ULL)
      return false;

    const uint64 result8 = result << 3U;
    const uint64 result2 = result << 1U;

    if (result2 > (0xFFFFFFFFFFFFFFFFULL - result8))
      return false;

    result = result8 + result2;

    uint c = p[0] - '0';
    if (c > (0xFFFFFFFFFFFFFFFFULL - result))
      return false;

    result += c;

    p++;
  }

  value = result;

  pBuf = p;

  return true;
}